

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O1

size_t rtosc_print_arg_vals
                 (rtosc_arg_val_t *args,size_t n,char *buffer,size_t bs,rtosc_print_options *opt,
                 int cols_used)

{
  char *__dest;
  char *__src;
  char cVar1;
  char *pcVar2;
  long lVar3;
  rtosc_print_options *opt_00;
  int32_t iVar4;
  size_t sVar5;
  void *pvVar6;
  ulong uVar7;
  uint8_t *puVar8;
  undefined1 *puVar9;
  char *dest;
  rtosc_arg_val_t *prev_arg_if_range;
  rtosc_arg_val_t *arg_out;
  size_t sVar10;
  rtosc_arg_val_t *prStack_90;
  rtosc_arg_val_t local_88;
  uint8_t *local_70;
  rtosc_print_options *local_68;
  char *local_60;
  int32_t local_54;
  size_t local_50;
  ulong local_48;
  size_t local_40;
  int local_34 [2];
  int cols_used_local;
  
  puVar9 = _compoundliteral;
  if (opt != (rtosc_print_options *)0x0) {
    puVar9 = &opt->lossless;
  }
  prStack_90 = (rtosc_arg_val_t *)0x10e5b9;
  local_50 = bs;
  local_34[0] = cols_used;
  local_88.val.t = strlen(((rtosc_print_options *)puVar9)->sep);
  lVar3 = -(n * 0x18 + 0xf & 0xfffffffffffffff0);
  local_88._0_8_ = (long)&local_88 + lVar3;
  if (n == 0) {
    local_40 = 0;
  }
  else {
    local_60 = buffer + -1;
    local_48 = (ulong)(cols_used != 0);
    puVar8 = (uint8_t *)0x0;
    local_40 = 0;
    local_70 = (uint8_t *)n;
    local_68 = (rtosc_print_options *)puVar9;
    do {
      opt_00 = local_68;
      arg_out = (rtosc_arg_val_t *)local_88._0_8_;
      *(undefined8 *)((long)&prStack_90 + lVar3) = 0x10e62b;
      local_54 = rtosc_convert_to_range(args,n - (long)puVar8,arg_out,opt_00);
      sVar10 = local_50;
      if (local_54 == 0) {
        arg_out = args;
      }
      prev_arg_if_range = args + -1;
      if (puVar8 == (uint8_t *)0x0) {
        prev_arg_if_range = (rtosc_arg_val_t *)0x0;
      }
      local_88.val.b.data = puVar8;
      *(undefined8 *)((long)&prStack_90 + lVar3) = 0x10e65c;
      sVar5 = rtosc_print_arg_val(arg_out,buffer,sVar10,opt_00,local_34,prev_arg_if_range);
      local_40 = local_40 + sVar5;
      dest = buffer + sVar5;
      sVar10 = sVar10 - sVar5;
      cVar1 = args->type;
      *(undefined8 *)((long)&prStack_90 + lVar3) = 0x10e67e;
      pvVar6 = memchr("-asb",(int)cVar1,5);
      pcVar2 = local_60;
      uVar7 = local_48;
      if (pvVar6 == (void *)0x0) {
        uVar7 = (ulong)((int)local_48 + 1);
        if ((opt_00->linelength < local_34[0]) && (0 < (int)local_48)) {
          *local_60 = '\n';
          __dest = local_60 + 5;
          __src = local_60 + 1;
          *(undefined8 *)((long)&prStack_90 + lVar3) = 0x10e6bb;
          memmove(__dest,__src,sVar5 + 1);
          local_34[0] = (int)sVar5 + 4;
          pcVar2[1] = ' ';
          pcVar2[2] = ' ';
          pcVar2[3] = ' ';
          pcVar2[4] = ' ';
          local_40 = local_40 + 4;
          dest = dest + 4;
          sVar10 = sVar10 - 4;
          uVar7 = 1;
        }
      }
      n = (size_t)local_70;
      iVar4 = local_54;
      local_48 = uVar7;
      if (local_54 == 0) {
        *(undefined8 *)((long)&prStack_90 + lVar3) = 0x10e6ff;
        iVar4 = next_arg_offset(args);
      }
      puVar8 = local_88.val.b.data + iVar4;
      buffer = dest;
      if (puVar8 < n) {
        pcVar2 = local_68->sep;
        *(undefined8 *)((long)&prStack_90 + lVar3) = 0x10e724;
        fast_strcpy(dest,pcVar2,sVar10);
        local_34[0] = local_34[0] + (int)local_88.val.h;
        local_40 = local_40 + (long)local_88.val.s;
        buffer = dest + local_88.val.h;
        n = (size_t)local_70;
        local_60 = dest;
        sVar10 = sVar10 - local_88.val._0_8_;
      }
      local_50 = sVar10;
      args = args + iVar4;
    } while (puVar8 < n);
  }
  return local_40;
}

Assistant:

size_t rtosc_print_arg_vals(const rtosc_arg_val_t *args, size_t n,
                            char *buffer, size_t bs,
                            const rtosc_print_options *opt, int cols_used)
{
    size_t wrt=0;
    int args_written_this_line = (cols_used) ? 1 : 0;
    if(!opt)
        opt = default_print_options;
    size_t sep_len = strlen(opt->sep);
    char* last_sep = buffer - 1;
    STACKALLOC(rtosc_arg_val_t, args_converted, n); // only used for range conversion

    for(size_t i = 0; i < n;)
    {
        int32_t conv = rtosc_convert_to_range(args, n-i, args_converted, opt);
        const rtosc_arg_val_t* input = conv ? args_converted : args;

        size_t tmp = rtosc_print_arg_val(input, buffer, bs, opt, &cols_used, (i == 0) ? NULL : (args-1));
        wrt += tmp;
        buffer += tmp;
        bs -= tmp;

        // these compute the newlines themselves
        if(! strchr("-asb", args->type))
        linebreak_check_after_write(&cols_used, &wrt, last_sep, &buffer, &bs,
                                    tmp, &args_written_this_line,
                                    opt->linelength);

        size_t inc = conv ? conv : next_arg_offset(args);
        i += inc;
        args += inc;
        if(i<n)
        {
            assert(sep_len < bs);
            last_sep = buffer;
            fast_strcpy(buffer, opt->sep, bs);
            cols_used += sep_len;
            wrt += sep_len;
            buffer += sep_len;
            bs -= sep_len;
        }
    }
    return wrt;
}